

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O3

void __thiscall
Assimp::SpatialSort::FindPositions
          (SpatialSort *this,aiVector3D *pPosition,ai_real pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  pointer *ppuVar1;
  float fVar2;
  float fVar3;
  pointer puVar4;
  pointer pEVar5;
  iterator __position;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ai_real *paVar12;
  pointer pEVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar14 = pPosition->x;
  fVar17 = pPosition->y;
  fVar15 = (this->mPlaneNormal).y;
  fVar16 = (this->mPlaneNormal).x;
  fVar2 = pPosition->z;
  fVar3 = (this->mPlaneNormal).z;
  puVar4 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  pEVar13 = (this->mPositions).
            super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar5 = (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pEVar5 - (long)pEVar13;
  if (lVar7 != 0) {
    fVar14 = fVar2 * fVar3 + fVar14 * fVar16 + fVar17 * fVar15;
    fVar17 = fVar14 + pRadius;
    if ((pEVar13->mDistance <= fVar17) &&
       (fVar14 = fVar14 - pRadius, paVar12 = &pEVar5[-1].mDistance,
       fVar14 < *paVar12 || fVar14 == *paVar12)) {
      uVar6 = (lVar7 >> 2) * -0x3333333333333333;
      uVar10 = uVar6 >> 1 & 0x7fffffff;
      if ((uint)uVar6 < 8) {
        uVar11 = (uint)uVar10;
      }
      else {
        uVar9 = uVar6 >> 2 & 0x3fffffff;
        do {
          uVar8 = (uint)uVar9;
          uVar11 = uVar8;
          if (fVar14 < pEVar13[uVar10].mDistance || fVar14 == pEVar13[uVar10].mDistance) {
            uVar11 = -uVar8;
          }
          uVar11 = uVar11 + (int)uVar10;
          uVar9 = uVar9 >> 1;
          uVar10 = (ulong)uVar11;
        } while (3 < uVar8);
      }
      uVar8 = 0;
      if (uVar11 != 0) {
        uVar10 = (ulong)uVar11;
        paVar12 = &pEVar13[uVar10].mDistance;
        do {
          if (*paVar12 <= fVar14) {
            uVar8 = (uint)uVar10;
            break;
          }
          uVar10 = uVar10 - 1;
          paVar12 = paVar12 + -5;
        } while ((int)uVar10 != 0);
      }
      do {
        uVar10 = (ulong)uVar8;
        if (uVar6 - 1 <= uVar10) break;
        uVar8 = uVar8 + 1;
      } while (pEVar13[uVar10].mDistance <= fVar14 && fVar14 != pEVar13[uVar10].mDistance);
      pEVar13 = pEVar13 + uVar10;
      do {
        if (fVar17 < pEVar13->mDistance || fVar17 == pEVar13->mDistance) {
          return;
        }
        fVar16 = (pEVar13->mPosition).x - pPosition->x;
        fVar14 = (pEVar13->mPosition).y - pPosition->y;
        fVar15 = (pEVar13->mPosition).z - pPosition->z;
        if (fVar15 * fVar15 + fVar16 * fVar16 + fVar14 * fVar14 < pRadius * pRadius) {
          __position._M_current =
               (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,__position,
                       &pEVar13->mIndex);
          }
          else {
            *__position._M_current = pEVar13->mIndex;
            ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        pEVar13 = pEVar13 + 1;
      } while (pEVar13 !=
               (this->mPositions).
               super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void SpatialSort::FindPositions( const aiVector3D& pPosition,
    ai_real pRadius, std::vector<unsigned int>& poResults) const
{
    const ai_real dist = pPosition * mPlaneNormal;
    const ai_real minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.size() == 0)
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    const ai_real pSquared = pRadius*pRadius;
    while( it->mDistance < maxDist)
    {
        if( (it->mPosition - pPosition).SquareLength() < pSquared)
            poResults.push_back( it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}